

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

MessagePattern * __thiscall
icu_63::MessagePattern::parse
          (MessagePattern *this,UnicodeString *pattern,UParseError *parseError,UErrorCode *errorCode
          )

{
  UErrorCode *errorCode_local;
  UParseError *parseError_local;
  UnicodeString *pattern_local;
  MessagePattern *this_local;
  
  preParse(this,pattern,parseError,errorCode);
  parseMessage(this,0,0,0,UMSGPAT_ARG_TYPE_NONE,parseError,errorCode);
  postParse(this);
  return this;
}

Assistant:

MessagePattern &
MessagePattern::parse(const UnicodeString &pattern, UParseError *parseError, UErrorCode &errorCode) {
    preParse(pattern, parseError, errorCode);
    parseMessage(0, 0, 0, UMSGPAT_ARG_TYPE_NONE, parseError, errorCode);
    postParse();
    return *this;
}